

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_entry_list_t.c
# Opt level: O3

MMDB_entry_data_list_s * test_int32_value(MMDB_entry_data_list_s *entry_data_list)

{
  MMDB_entry_data_list_s *pMVar1;
  
  pMVar1 = entry_data_list->next;
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x6d,(pMVar1->entry_data).type,"==",8,"\'int32\' key\'s value is an int32",0);
  cmp_ok_at_loc("/workspace/llm4binary/github/license_c_cmakelists/maxmind[P]libmaxminddb/t/data_entry_list_t.c"
                ,0x74,(pMVar1->entry_data).field_1.int32,"==",-0x10000000,
                "got expected value for int32 key",0);
  return pMVar1;
}

Assistant:

MMDB_entry_data_list_s *
test_int32_value(MMDB_entry_data_list_s *entry_data_list) {
    MMDB_entry_data_list_s *value = entry_data_list = entry_data_list->next;

    cmp_ok(value->entry_data.type,
           "==",
           MMDB_DATA_TYPE_INT32,
           "'int32' key's value is an int32");

    int32_t expect = 1 << 28;
    expect *= -1;
    cmp_ok(value->entry_data.int32,
           "==",
           expect,
           "got expected value for int32 key");

    return entry_data_list;
}